

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig(LaunchHelper *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  string srcdir;
  string fname;
  cmGeneratedFileStream fout;
  allocator local_2b9;
  string local_2b8;
  string local_298;
  char *local_278 [4];
  cmGeneratedFileStream local_258;
  
  WriteScrapeMatchers(this,"Warning",&this->Handler->ReallyCustomWarningMatches);
  WriteScrapeMatchers(this,"WarningSuppress",&this->Handler->ReallyCustomWarningExceptions);
  std::__cxx11::string::string((string *)local_278,(string *)&this->Handler->CTestLaunchDir);
  std::__cxx11::string::append((char *)local_278);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_258,local_278[0],false);
  this_00 = this->CTest;
  std::__cxx11::string::string((string *)&local_2b8,"SourceDirectory",&local_2b9);
  cmCTest::GetCTestConfiguration(&local_298,this_00,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  poVar1 = std::operator<<((ostream *)&local_258,"set(CTEST_SOURCE_DIRECTORY \"");
  poVar1 = std::operator<<(poVar1,(string *)&local_298);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&local_298);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_258);
  std::__cxx11::string::~string((string *)local_278);
  return;
}

Assistant:

void cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig()
{
  this->WriteScrapeMatchers("Warning",
                            this->Handler->ReallyCustomWarningMatches);
  this->WriteScrapeMatchers("WarningSuppress",
                            this->Handler->ReallyCustomWarningExceptions);

  // Give some testing configuration information to the launcher.
  std::string fname = this->Handler->CTestLaunchDir;
  fname += "/CTestLaunchConfig.cmake";
  cmGeneratedFileStream fout(fname.c_str());
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  fout << "set(CTEST_SOURCE_DIRECTORY \"" << srcdir << "\")\n";
}